

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

int convert85(uchar *bytes4,uchar *chars5)

{
  uint uVar1;
  uint val;
  uchar *chars5_local;
  uchar *bytes4_local;
  
  if ((((*bytes4 == '\0') && (bytes4[1] == '\0')) && (bytes4[2] == '\0')) && (bytes4[3] == '\0')) {
    *chars5 = 'z';
    bytes4_local._4_4_ = 1;
  }
  else {
    uVar1 = (uint)*bytes4 * 0x1000000 + (uint)bytes4[1] * 0x10000 + (uint)bytes4[2] * 0x100 +
            (uint)bytes4[3];
    *chars5 = (char)((ulong)uVar1 / 0x31c84b1) + '!';
    uVar1 = uVar1 % 0x31c84b1;
    chars5[1] = (char)(uVar1 / 0x95eed) + '!';
    uVar1 = uVar1 % 0x95eed;
    chars5[2] = (char)(uVar1 / 0x1c39) + '!';
    uVar1 = uVar1 % 0x1c39;
    chars5[3] = (char)(uVar1 / 0x55) + '!';
    chars5[4] = (char)((ulong)uVar1 % 0x55) + '!';
    bytes4_local._4_4_ = 5;
  }
  return bytes4_local._4_4_;
}

Assistant:

static int convert85(const uchar *bytes4, uchar *chars5)
{
  if (bytes4[0] == 0 && bytes4[1] == 0 && bytes4[2] == 0 && bytes4[3] == 0) {
    chars5[0] = 'z';
    return 1;
  }
  unsigned val = bytes4[0]*(256*256*256) + bytes4[1]*(256*256) + bytes4[2]*256 + bytes4[3];
  chars5[0] = val / 52200625 + 33; // 52200625 = 85 to the 4th
  val = val % 52200625;
  chars5[1] = val / 614125 + 33;   // 614125 = 85 cube
  val = val % 614125;
  chars5[2] = val / 7225 + 33;     // 7225 = 85 squared
  val = val % 7225;
  chars5[3] = val / 85 + 33;
  chars5[4] = val % 85 + 33;
  return 5;
}